

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int __base;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  char *pEnd;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  cVar1 = *param;
  local_38._M_len = strlen(param);
  __str._M_str = "0b";
  __str._M_len = 2;
  local_38._M_str = param;
  iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,2,__str);
  if (iVar2 == 0) {
LAB_0056ce71:
    param = param + 2;
  }
  else {
    local_38._M_len = strlen(param);
    __str_00._M_str = "0B";
    __str_00._M_len = 2;
    local_38._M_str = param;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,2,__str_00);
    if (iVar2 == 0) goto LAB_0056ce71;
    local_38._M_len = strlen(param);
    __str_01._M_str = "-0b";
    __str_01._M_len = 3;
    local_38._M_str = param;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,3,__str_01);
    if (iVar2 != 0) {
      local_38._M_len = strlen(param);
      __str_02._M_str = "-0B";
      __str_02._M_len = 3;
      local_38._M_str = param;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,3,__str_02)
      ;
      if (iVar2 != 0) {
        local_38._M_len = strlen(param);
        __base = 0;
        __str_03._M_str = "+0b";
        __str_03._M_len = 3;
        local_38._M_str = param;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_38,0,3,__str_03);
        if (iVar2 != 0) {
          local_38._M_len = strlen(param);
          __str_04._M_str = "+0B";
          __str_04._M_len = 3;
          local_38._M_str = param;
          iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_38,0,3,__str_04);
          if (iVar2 != 0) goto LAB_0056ce7b;
        }
      }
    }
    param = param + 3;
  }
  __base = 2;
LAB_0056ce7b:
  lVar3 = strtol(param,(char **)&local_38,__base);
  if ((((char *)local_38._M_len != param) && (*(char *)local_38._M_len == '\0')) &&
     (piVar4 = __errno_location(), *piVar4 != 0x22)) {
    lVar5 = -lVar3;
    if (lVar3 < 1) {
      lVar5 = lVar3;
    }
    if (cVar1 != '-') {
      lVar5 = lVar3;
    }
    *outResult = lVar5;
    return true;
  }
  return false;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }